

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O3

cell_index_t itree_add_child(itree_t *t,cell_index_t parent,cell_id_t id)

{
  uint uVar1;
  cell_t *pcVar2;
  uint end;
  cell_index_t cVar3;
  cell_t *cell;
  ulong uVar4;
  
  pcVar2 = t->cell;
  end = pcVar2[parent].child;
  uVar4 = (ulong)end;
  if (uVar4 == 0xffffffff) {
    end = t->n_cell;
    if (t->max_n_cell <= end) {
      __assert_fail("t->n_cell < t->max_n_cell",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
                    ,0x4d,"cell_index_t itree_new_cell(itree_t *)");
    }
    t->n_cell = end + 1;
    pcVar2[parent].child = end;
    pcVar2[end].id = id;
    pcVar2[end].child = 0xffffffff;
    pcVar2[end].sib = 0xffffffff;
  }
  else {
    uVar1 = pcVar2[uVar4].id;
    while( true ) {
      if (uVar1 == 0xffffffff) {
        cVar3 = itree_add_sib(t,end,id);
        return cVar3;
      }
      end = (uint)uVar4;
      if (pcVar2[uVar4].id == id) break;
      uVar1 = pcVar2[uVar4].sib;
      uVar4 = (ulong)uVar1;
    }
  }
  return end;
}

Assistant:

cell_index_t itree_add_child(itree_t *t,
			     cell_index_t parent,
			     cell_id_t id)
{
    cell_index_t end;
    cell_index_t child;
    cell_index_t new;
    cell_t *cell;

    cell = t->cell;

    if (cell[parent].child == NO_ID) {
	new = itree_new_cell(t);

	cell[parent].child = new;

	cell[new].id = id;
	cell[new].sib = NULL_INDEX;
	cell[new].child = NULL_INDEX;

	child = new;
    }
    else {
	child = itree_find(t, &end, cell[parent].child, id);
	if (child == NULL_INDEX) {
	    child = itree_add_sib(t, end, id);
	}
    }

    return child;
}